

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O1

void free_buckets(__cilkrts_worker *w,bucket **buckets,size_t nbuckets)

{
  bucket *p0;
  size_t sVar1;
  
  if (nbuckets != 0) {
    sVar1 = 0;
    do {
      p0 = buckets[sVar1];
      if (p0 != (bucket *)0x0) {
        __cilkrts_frame_free(w,p0,p0->nmax * 0x18 + 0x20);
        buckets[sVar1] = (bucket *)0x0;
      }
      sVar1 = sVar1 + 1;
    } while (nbuckets != sVar1);
  }
  __cilkrts_frame_free(w,buckets,nbuckets << 3);
  return;
}

Assistant:

static void free_buckets(__cilkrts_worker  *w, 
                         bucket           **buckets,
                         size_t             nbuckets)
{
    size_t i;

#if REDPAR_DEBUG >= 1
    verify_current_wkr(w);
    fprintf(stderr, "W=%d, desc=free_buckets, buckets=%p, size=%zd\n",
	    w->self, buckets,
	    nbuckets * sizeof(*buckets));
#endif

    for (i = 0; i < nbuckets; ++i)
        free_bucket(w, buckets + i);

    __cilkrts_frame_free(w, buckets, nbuckets * sizeof(*buckets));
}